

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1e75e5::LaneBasedExecutionQueue::executeProcess
          (LaneBasedExecutionQueue *this,QueueJobContext *opaqueContext,
          ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> completionFn,
          ProcessDelegate *delegate)

{
  ProcessHandle handle;
  _func_int **pp_Var1;
  ProcessContext *ctx;
  POSIXEnvironment environment_00;
  ProcessAttributes attr;
  StringRef value;
  _Any_data *p_Var2;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *this_00;
  iterator __begin2;
  long lVar3;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar4;
  char **ppcVar5;
  StringRef key;
  StringRef key_00;
  undefined8 in_stack_fffffffffffffde0;
  Child CVar6;
  Child CVar7;
  undefined2 uVar8;
  undefined6 uVar9;
  code *pcVar10;
  QueueJobContext *pQVar11;
  QueueJobContext *pQVar12;
  unique_lock<std::mutex> lock;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *local_1a8;
  undefined8 local_1a0;
  code *local_198;
  code *local_190;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  POSIXEnvironment posixEnv;
  SmallString<64U> description;
  POSIXEnvironment local_a0;
  
  ppVar4 = environment.Data;
  description.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>;
  description.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  description.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  (**(code **)(*(long *)*opaqueContext[3]._vptr_QueueJobContext + 0x18))
            (*opaqueContext[3]._vptr_QueueJobContext,&description);
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->readyJobsMutex);
  if (this->cancelled == true) {
    if (*(char *)(completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 0x20
                 ) == '\x01') {
      p_Var2 = (_Any_data *)
               llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getPointer
                         ((Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)
                          completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer.
                          _0_8_);
      local_170 = 0;
      posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xffffffff00000002;
      local_180 = 0;
      uStack_178 = 0;
      posixEnv.envStorage.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(uStack_184,0xffffffff);
      posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      posixEnv.envStorage.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (*(long *)(p_Var2 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(p_Var2->_M_pod_data + 0x18))(p_Var2,(ProcessResult *)&posixEnv);
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  }
  else {
    pQVar11 = opaqueContext + 2;
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    posixEnv.keys._M_h._M_buckets = &posixEnv.keys._M_h._M_single_bucket;
    posixEnv.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    posixEnv.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    posixEnv.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    posixEnv.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    posixEnv.keys._M_h._M_element_count = 0;
    posixEnv.keys._M_h._M_bucket_count = 1;
    posixEnv.keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    posixEnv.keys._M_h._M_rehash_policy._4_4_ = 0;
    posixEnv.keys._M_h._M_rehash_policy._M_next_resize = 0;
    posixEnv.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    posixEnv.isFrozen = false;
    llvm::Twine::str_abi_cxx11_((string *)&lock,(Twine *)&stack0xfffffffffffffde8);
    key.Length = 0x10;
    key.Data = "LLBUILD_BUILD_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&posixEnv,key,(StringRef)lock);
    std::__cxx11::string::_M_dispose();
    llvm::Twine::str_abi_cxx11_((string *)&lock,(Twine *)&stack0xfffffffffffffde8);
    key_00.Length = 0xf;
    key_00.Data = "LLBUILD_LANE_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&posixEnv,key_00,(StringRef)lock);
    std::__cxx11::string::_M_dispose();
    for (lVar3 = environment.Length << 5; lVar3 != 0; lVar3 = lVar3 + -0x20) {
      llbuild::basic::POSIXEnvironment::setIfMissing(&posixEnv,ppVar4->first,ppVar4->second);
      ppVar4 = ppVar4 + 1;
    }
    if (attributes.inheritEnvironment != false) {
      for (ppcVar5 = this->environment; *ppcVar5 != (char *)0x0; ppcVar5 = ppcVar5 + 1) {
        strlen(*ppcVar5);
        llvm::StringRef::split
                  ((pair<llvm::StringRef,_llvm::StringRef> *)&lock,
                   (StringRef *)&stack0xfffffffffffffde8,'=');
        value.Length = in_stack_fffffffffffffe40;
        value.Data = (char *)in_stack_fffffffffffffe38;
        llbuild::basic::POSIXEnvironment::setIfMissing(&posixEnv,(StringRef)lock,value);
      }
    }
    handle.id = (uint64_t)opaqueContext[1]._vptr_QueueJobContext;
    CVar7.twine = (Twine *)0x0;
    pcVar10 = std::
              _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:434:34)>
              ::_M_invoke;
    uVar8._0_1_ = SmallStringKind;
    uVar8._1_1_ = 0x2b;
    uVar9 = 0x14;
    pQVar12 = opaqueContext;
    CVar6 = (Child)this;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)&lock,
               (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_);
    pp_Var1 = opaqueContext[2]._vptr_QueueJobContext;
    local_1a0 = 0;
    this_00 = (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
              operator_new(0x30);
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              (this_00,(OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
                        *)&lock);
    *(_func_int ***)this_00[1].storage.super_AlignedCharArray<8UL,_32UL>.buffer = pp_Var1;
    local_190 = std::
                _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:450:7)>
                ::_M_invoke;
    local_198 = std::
                _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:450:7)>
                ::_M_manager;
    local_1a8 = this_00;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::reset
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)&lock)
    ;
    if (completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._8_8_ == 0) {
      completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._8_8_ =
           (this->super_ExecutionQueue).delegate;
    }
    ctx = (ProcessContext *)*opaqueContext[3]._vptr_QueueJobContext;
    llbuild::basic::POSIXEnvironment::POSIXEnvironment(&local_a0,&posixEnv);
    environment_00.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)attributes._0_8_;
    environment_00.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_a0;
    environment_00.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)attributes.workingDir.Data;
    environment_00.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)attributes.workingDir.Length;
    environment_00.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)attributes._24_8_;
    environment_00.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xfffffffffffffde8;
    environment_00.keys._M_h._M_buckets = (__buckets_ptr)&local_1a8;
    environment_00.keys._M_h._M_bucket_count = in_stack_fffffffffffffde0;
    environment_00.keys._M_h._M_before_begin._M_nxt._0_4_ = CVar6.decUI;
    environment_00.keys._M_h._M_before_begin._M_nxt._4_4_ = CVar6._4_4_;
    environment_00.keys._M_h._M_element_count = (size_type)CVar7.twine;
    environment_00.keys._M_h._M_rehash_policy._M_max_load_factor._0_1_ = (NodeKind)uVar8;
    environment_00.keys._M_h._M_rehash_policy._M_max_load_factor._1_1_ = SUB21(uVar8,1);
    environment_00.keys._M_h._M_rehash_policy._2_6_ = uVar9;
    environment_00.keys._M_h._M_rehash_policy._M_next_resize = (size_t)pcVar10;
    environment_00.keys._M_h._M_single_bucket = (__node_base_ptr)pQVar11;
    environment_00._104_8_ = pQVar12;
    attr.workingDir.Length = (size_t)lock._M_device;
    attr.inheritEnvironment = lock._M_owns;
    attr.controlEnabled = (bool)lock._9_1_;
    attr._26_6_ = lock._10_6_;
    attr._0_16_ = commandLine;
    llbuild::basic::spawnProcess
              ((ProcessDelegate *)
               completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._8_8_,ctx,
               &this->spawnedProcesses,handle,commandLine,environment_00,attr,
               (ProcessReleaseFn *)in_stack_fffffffffffffe38,
               (ProcessCompletionFn *)in_stack_fffffffffffffe40);
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment(&local_a0);
    if (local_198 != (code *)0x0) {
      (*local_198)(&local_1a8,&local_1a8,3);
    }
    if ((code *)CONCAT62(uVar9,uVar8) != (code *)0x0) {
      (*(code *)CONCAT62(uVar9,uVar8))(&stack0xfffffffffffffde8,&stack0xfffffffffffffde8,3);
    }
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment(&posixEnv);
  }
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&description);
  return;
}

Assistant:

virtual void executeProcess(
      QueueJobContext* opaqueContext,
      ArrayRef<StringRef> commandLine,
      ArrayRef<std::pair<StringRef, StringRef>> environment,
      ProcessAttributes attributes,
      llvm::Optional<ProcessCompletionFn> completionFn,
      ProcessDelegate* delegate
  ) override {

    LaneBasedExecutionQueueJobContext& context =
      *reinterpret_cast<LaneBasedExecutionQueueJobContext*>(opaqueContext);

    llvm::SmallString<64> description;
    context.job.getDescriptor()->getShortDescription(description);
    TracingExecutionQueueSubprocessStart(context.laneNumber, description.str());

    {
      std::unique_lock<std::mutex> lock(readyJobsMutex);
      // Do not execute new processes anymore after cancellation.
      if (cancelled) {
        if (completionFn.hasValue())
          completionFn.getValue()(ProcessResult::makeCancelled());
        return;
      }
    }

    // Form the complete environment.
    //
    // NOTE: We construct the environment in order of precedence, so
    // overridden keys should be defined first.
    POSIXEnvironment posixEnv;

    // Export lane ID to subprocesses.
    posixEnv.setIfMissing("LLBUILD_BUILD_ID", Twine(buildID).str());
    posixEnv.setIfMissing("LLBUILD_LANE_ID", Twine(context.laneNumber).str());

    // Add the requested environment.
    for (const auto& entry: environment) {
      posixEnv.setIfMissing(entry.first, entry.second);
    }

    // Inherit the base environment, if desired.
    //
    // FIXME: This involves a lot of redundant allocation, currently. We could
    // cache this for the common case of a directly inherited environment.
    if (attributes.inheritEnvironment) {
      for (const char* const* p = this->environment; *p != nullptr; ++p) {
        auto pair = StringRef(*p).split('=');
        posixEnv.setIfMissing(pair.first, pair.second);
      }
    }

    // Assign a process handle, which just needs to be unique for as long as we
    // are communicating with the delegate.
    ProcessHandle handle;
    handle.id = context.jobID;

    ProcessReleaseFn releaseFn = [this](std::function<void()>&& processWait) {
      auto previousTaskCount = backgroundTaskCount.fetch_add(1);
      if (previousTaskCount < backgroundTaskMax) {
        // Launch the process wait on a detached thread
        std::thread([this, processWait=std::move(processWait)]() mutable {
          processWait();
          backgroundTaskCount--;
        }).detach();
      } else {
        backgroundTaskCount--;
        // not allowed to release, call wait directly
        processWait();
      }
    };

    ProcessCompletionFn laneCompletionFn{
      [completionFn, lane=context.laneNumber](ProcessResult result) mutable {
        TracingExecutionQueueSubprocessResult(lane, result.pid, result.utime,
                                              result.stime, result.maxrss);
        if (completionFn.hasValue())
          completionFn.getValue()(result);
      }
    };

    spawnProcess(
        delegate ? *delegate : getDelegate(),
        reinterpret_cast<ProcessContext*>(context.job.getDescriptor()),
        spawnedProcesses,
        handle,
        commandLine,
        posixEnv,
        attributes,
        std::move(releaseFn),
        std::move(laneCompletionFn)
    );
  }